

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type_visitor.cc
# Opt level: O0

void __thiscall iqxmlrpc::Print_value_visitor::do_visit_array(Print_value_visitor *this,Array *a)

{
  bool bVar1;
  Value *this_00;
  undefined1 local_28 [16];
  CI i;
  Array *a_local;
  Print_value_visitor *this_local;
  
  i.i._M_current = (const_iterator)(const_iterator)a;
  std::operator<<(this->out_,"[");
  Array::begin((Array *)(local_28 + 8));
  while( true ) {
    Array::end((Array *)local_28);
    bVar1 = Array::const_iterator::operator!=
                      ((const_iterator *)(local_28 + 8),(const_iterator *)local_28);
    Array::const_iterator::~const_iterator((const_iterator *)local_28);
    if (!bVar1) break;
    std::operator<<(this->out_," ");
    this_00 = Array::const_iterator::operator->((const_iterator *)(local_28 + 8));
    Value::apply_visitor(this_00,&this->super_Value_type_visitor);
    std::operator<<(this->out_,",");
    Array::const_iterator::operator++((const_iterator *)(local_28 + 8));
  }
  Array::const_iterator::~const_iterator((const_iterator *)(local_28 + 8));
  std::operator<<(this->out_," ]");
  return;
}

Assistant:

void Print_value_visitor::do_visit_array(const Array& a)
{
  out_ << "[";

  typedef Array::const_iterator CI;
  for(CI i = a.begin(); i != a.end(); ++i )
  {
    out_ << " ";
    i->apply_visitor(*this);
    out_ << ",";
  }

  out_ << " ]";
}